

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# b_tree_node.cpp
# Opt level: O3

void __thiscall b_tree_node::_insert_non_full(b_tree_node *this,int64_t k,int64_t v)

{
  ushort uVar1;
  long lVar2;
  int iVar3;
  uint uVar4;
  runtime_error *this_00;
  uint uVar5;
  ulong uVar6;
  b_tree_node new_child;
  b_tree_node child;
  b_tree_node local_100;
  b_tree_node local_98;
  
  uVar1 = *this->_num_keys_field;
  uVar6 = (ulong)uVar1;
  uVar5 = uVar1 - 1;
  if (*this->_leaf_field == 0) {
    if (uVar1 != 0) {
      do {
        iVar3 = (int)uVar6;
        uVar5 = iVar3 - 1;
        if (this->_keys_field[uVar5] <= k) goto LAB_00108bbb;
        uVar6 = (ulong)(iVar3 - 1U);
      } while (iVar3 - 1U != 0 && 0 < iVar3);
      uVar5 = 0xffffffff;
    }
LAB_00108bbb:
    uVar4 = uVar5 + 1;
    b_tree_node(&local_98,this->_p,this->_child_ofs_field[uVar4 & 0xffff]);
    if (((uint)*this->_min_degree_field * 2 - 1 == (uint)*local_98._num_keys_field) &&
       (_split_child(this,uVar4,this->_child_ofs_field[uVar4 & 0xffff]),
       this->_keys_field[uVar4] < k)) {
      uVar5 = uVar4;
    }
    b_tree_node(&local_100,this->_p,this->_child_ofs_field[(long)(int)uVar5 + 1]);
    _insert_non_full(&local_100,k,v);
    r_memory_map::~r_memory_map(&local_100._mm);
    r_memory_map::~r_memory_map(&local_98._mm);
  }
  else {
    if (uVar1 != 0) {
      do {
        uVar4 = (int)uVar6 - 1;
        lVar2 = this->_keys_field[uVar4];
        if (lVar2 <= k) {
          uVar5 = (int)uVar6 - 1;
          if ((lVar2 == k) && (this->_valid_keys_field[uVar4] == '\x01')) {
            this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(this_00,"Duplicate key");
            __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          goto LAB_00108c6d;
        }
        this->_keys_field[uVar6] = lVar2;
        this->_valid_keys_field[uVar6] = this->_valid_keys_field[uVar4];
        this->_vals_field[uVar6] = this->_vals_field[uVar4];
        uVar6 = uVar6 - 1;
      } while (0 < (int)uVar6);
      uVar5 = 0xffffffff;
    }
LAB_00108c6d:
    uVar5 = uVar5 + 1;
    this->_keys_field[uVar5] = k;
    this->_valid_keys_field[uVar5] = '\x01';
    this->_vals_field[uVar5] = v;
    *this->_num_keys_field = *this->_num_keys_field + 1;
  }
  return;
}

Assistant:

void b_tree_node::_insert_non_full(int64_t k, int64_t v)
{
    // Initialize index as index of rightmost element
    int i = _num_keys()-1;
 
    // If this is a leaf node
    if (_leaf())
    {
        // The following loop does two things
        // a) Finds the location of new key to be inserted
        // b) Moves all greater keys to one place ahead
        while (i >= 0 && _keys_field[i] > k)
        {
            _keys_field[i+1] = _keys_field[i];
            _valid_keys_field[i+1] = _valid_keys_field[i];
            _vals_field[i+1] = _vals_field[i];
            i--;
        }

        if(i >= 0 && (_keys_field[i] == k && _valid_keys_field[i] == 1))
            throw runtime_error("Duplicate key");
 
        // Insert the new key at found location
        _keys_field[i+1] = k;
        _valid_keys_field[i+1] = 1;
        _vals_field[i+1] = v;
        _set_num_keys(_num_keys() + 1);
    }
    else // If this node is not leaf
    {
        // Find the child which is going to have the new key
        while (i >= 0 && _keys_field[i] > k)
            i--;
 
        b_tree_node child(_p, _child_ofs(i+1));
        // See if the found child is full
        if (child._num_keys() == 2*_min_degree() - 1)
        {
            // If the child is full, then split it
            _split_child(i+1, _child_ofs(i+1));
 
            // After split, the middle key of _child_ofs[i] goes up and
            // _child_ofs[i] is splitted into two.  See which of the two
            // is going to have the new key
            if (_keys_field[i+1] < k)
                i++;
        }

        b_tree_node new_child(_p, _child_ofs_field[i+1]);
        new_child._insert_non_full(k, v);
    }
}